

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O1

bsp_pid_t bsp_nprocs(void)

{
  int init;
  int nprocs;
  int fini;
  int local_14;
  bsp_pid_t local_10;
  int local_c;
  
  if (s_spmd != (Spmd *)0x0) {
    return s_spmd->m_nprocs;
  }
  MPI_Initialized(&local_14);
  MPI_Finalized(&local_c);
  if (local_c != 0) {
    bsp_abort("bsp_nprocs: internal error\n");
  }
  if (local_14 == 0) {
    MPI_Init(0,0);
    atexit(bsp_check_exit);
  }
  local_10 = -1;
  MPI_Comm_size(&ompi_mpi_comm_world,&local_10);
  return local_10;
}

Assistant:

bsp_pid_t bsp_nprocs()
{
    if (!s_spmd) {
        int init, fini;
        MPI_Initialized( & init );
        MPI_Finalized( &fini );
        if ( fini )
            bsp_abort("bsp_nprocs: internal error\n");
        
        if (!init ) {
            MPI_Init(NULL, NULL);
            atexit( bsp_check_exit );
        }

        int nprocs = -1;
        MPI_Comm_size( MPI_COMM_WORLD, &nprocs);

        return nprocs;
    }
    else {
        return s_spmd->nprocs();
    }
}